

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls-test.c++
# Opt level: O0

Promise<void> __thiscall
kj::anon_unknown_0::TlsTest::readFromClient(TlsTest *this,AsyncIoStream *server)

{
  Array<unsigned_char> *other;
  int in_EDX;
  ArrayPtr<unsigned_char> AVar1;
  undefined1 local_78 [8];
  Type checkBuffer;
  undefined1 local_40 [8];
  Promise<void> readPromise;
  Array<unsigned_char> buf;
  AsyncIoStream *server_local;
  TlsTest *this_local;
  
  heapArray<unsigned_char>((Array<unsigned_char> *)&readPromise,4);
  AVar1 = kj::Array::operator_cast_to_ArrayPtr((Array *)&readPromise);
  AsyncInputStream::read((AsyncInputStream *)local_40,in_EDX,AVar1.ptr,AVar1.size_);
  other = mv<kj::Array<unsigned_char>>((Array<unsigned_char> *)&readPromise);
  Array<unsigned_char>::Array((Array<unsigned_char> *)local_78,other);
  mv<kj::(anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::_lambda()_1_>
            ((Type *)local_78);
  Promise<void>::
  then<kj::(anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::_lambda()_1_>
            ((Promise<void> *)this,(Type *)local_40);
  (anonymous_namespace)::TlsTest::readFromClient(kj::AsyncIoStream&)::{lambda()#1}::~AsyncIoStream
            ((_lambda___1_ *)local_78);
  Promise<void>::~Promise((Promise<void> *)local_40);
  Array<unsigned_char>::~Array((Array<unsigned_char> *)&readPromise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<void> readFromClient(AsyncIoStream& server) {
    auto buf = heapArray<byte>(4);

    auto readPromise = server.read(buf);

    auto checkBuffer = [buf = kj::mv(buf)]() {
      KJ_ASSERT(buf == "foo\x00"_kjb);
    };

    return readPromise.then(kj::mv(checkBuffer));
  }